

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

INT32 __thiscall PlayerA::CalcSongVolume(PlayerA *this)

{
  PlayerBase *pPVar1;
  int iVar2;
  int iVar3;
  PLR_SONG_INFO songInfo;
  undefined1 local_30 [24];
  int local_18;
  
  iVar3 = (this->_config).masterVol;
  if (((this->_config).ignoreVolGain == false) &&
     (pPVar1 = this->_player, pPVar1 != (PlayerBase *)0x0)) {
    iVar2 = (*pPVar1->_vptr_PlayerBase[8])(pPVar1,local_30);
    if ((char)iVar2 == '\0') {
      iVar3 = (int)((ulong)((long)local_18 * (long)iVar3) >> 0x10);
    }
  }
  return iVar3;
}

Assistant:

INT32 PlayerA::CalcSongVolume(void)
{
	INT32 volume = _config.masterVol;
	
	if (! _config.ignoreVolGain && _player != NULL)
	{
		PLR_SONG_INFO songInfo;
		UINT8 retVal = _player->GetSongInfo(songInfo);
		if (! retVal)
			volume = MUL16X16_FIXED(volume, songInfo.volGain);
	}
	
	return volume;
}